

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

ULONGLONG PAL__wcstoui64(char16_t *nptr,char16_t **endptr,int base)

{
  int iVar1;
  DWORD DVar2;
  DWORD dwLastError;
  int size;
  unsigned_long_long res;
  char *s_endptr;
  char *s_nptr;
  char16_t **ppcStack_18;
  int base_local;
  char16_t **endptr_local;
  char16_t *nptr_local;
  
  s_endptr = (char *)0x0;
  res = 0;
  s_nptr._4_4_ = base;
  ppcStack_18 = endptr;
  endptr_local = (char16_t **)nptr;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = WideCharToMultiByte(0,0,nptr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar1 == 0) {
    DVar2 = GetLastError();
    fprintf(_stderr,"] %s %s:%d","PAL__wcstoui64",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
            ,0x343);
    fprintf(_stderr,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar2);
    SetLastError(0x57);
    _dwLastError = 0;
  }
  else {
    s_endptr = (char *)PAL_malloc((long)iVar1);
    if (s_endptr == (LPSTR)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(8);
      _dwLastError = 0;
    }
    else {
      iVar1 = WideCharToMultiByte(0,0,(LPCWSTR)endptr_local,-1,s_endptr,iVar1,(LPCSTR)0x0,
                                  (LPBOOL)0x0);
      if (iVar1 == 0) {
        DVar2 = GetLastError();
        fprintf(_stderr,"] %s %s:%d","PAL__wcstoui64",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
                ,0x354);
        fprintf(_stderr,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar2);
        SetLastError(0x57);
        _dwLastError = 0;
      }
      else {
        _dwLastError = strtoull(s_endptr,(char **)&res,s_nptr._4_4_);
        if (ppcStack_18 != (char16_t **)0x0) {
          *ppcStack_18 = (char16_t *)((long)endptr_local + (long)((int)res - (int)s_endptr) * 2);
        }
      }
    }
  }
  PAL_free(s_endptr);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return _dwLastError;
  }
  abort();
}

Assistant:

ULONGLONG
__cdecl
PAL__wcstoui64(
        const char16_t *nptr,
        char16_t **endptr,
        int base)
{
    char *s_nptr = 0;
    char *s_endptr = 0;
    unsigned long long res;
    int size;
    DWORD dwLastError = 0;

    PERF_ENTRY(wcstoul);
    ENTRY("_wcstoui64 (nptr=%p (%S), endptr=%p, base=%d)\n", nptr?nptr:W16_NULLSTRING, nptr?nptr:W16_NULLSTRING,
          endptr, base);

    size = WideCharToMultiByte(CP_ACP, 0, nptr, -1, NULL, 0, NULL, NULL);
    if (!size)
    {
        dwLastError = GetLastError();
        ASSERT("WideCharToMultiByte failed.  Error is %d\n", dwLastError);
        SetLastError(ERROR_INVALID_PARAMETER);
        res = 0;
        goto PAL__wcstoui64Exit;
    }
    s_nptr = (char *)PAL_malloc(size);
    if (!s_nptr)
    {
        ERROR("PAL_malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        res = 0;
        goto PAL__wcstoui64Exit;
    }
    size = WideCharToMultiByte(CP_ACP, 0, nptr, -1, s_nptr, size, NULL, NULL);
    if (!size)
    {
        dwLastError = GetLastError();
        ASSERT("WideCharToMultiByte failed.  Error is %d\n", dwLastError);
        SetLastError(ERROR_INVALID_PARAMETER);
        res = 0;
        goto PAL__wcstoui64Exit;
    }

    res = strtoull(s_nptr, &s_endptr, base);

    /* only ASCII characters will be accepted by strtoull, and those always get
       mapped to single-byte characters, so the first rejected character will
       have the same index in the multibyte and widechar strings */
    if( endptr )
    {
        size = s_endptr - s_nptr;
        *endptr = (char16_t *)&nptr[size];
    }

PAL__wcstoui64Exit:
    PAL_free(s_nptr);
    LOGEXIT("_wcstoui64 returning unsigned long long %llu\n", res);
    PERF_EXIT(_wcstoui64);

    return res;
}